

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_ref(lua_State *L,int t)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  size_t sVar4;
  int in_ESI;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int ref;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if ((in_ESI < 1) && (-10000 < in_ESI)) {
    iVar1 = lua_gettop(in_RDI);
    in_ESI = iVar1 + in_ESI + 1;
  }
  iVar1 = in_ESI;
  iVar2 = lua_type((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_ESI);
  if (iVar2 == 0) {
    lua_settop((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    iVar2 = -1;
  }
  else {
    lua_rawgeti(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    lVar3 = lua_tointeger((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,(int)((ulong)in_RDI >> 0x20));
    iVar2 = (int)lVar3;
    lua_settop((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    if (iVar2 == 0) {
      sVar4 = lua_objlen(in_RDI,iVar1);
      iVar2 = (int)sVar4 + 1;
    }
    else {
      lua_rawgeti(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
      lua_rawseti((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    lua_rawseti((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return iVar2;
}

Assistant:

LUALIB_API int luaL_ref(lua_State *L, int t)
{
  int ref;
  t = abs_index(L, t);
  if (lua_isnil(L, -1)) {
    lua_pop(L, 1);  /* remove from stack */
    return LUA_REFNIL;  /* `nil' has a unique fixed reference */
  }
  lua_rawgeti(L, t, FREELIST_REF);  /* get first free element */
  ref = (int)lua_tointeger(L, -1);  /* ref = t[FREELIST_REF] */
  lua_pop(L, 1);  /* remove it from stack */
  if (ref != 0) {  /* any free element? */
    lua_rawgeti(L, t, ref);  /* remove it from list */
    lua_rawseti(L, t, FREELIST_REF);  /* (t[FREELIST_REF] = t[ref]) */
  } else {  /* no free elements */
    ref = (int)lua_objlen(L, t);
    ref++;  /* create new reference */
  }
  lua_rawseti(L, t, ref);
  return ref;
}